

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::overlap_iterator::unionWith
          (overlap_iterator *this,monostate *value,allocator_type *alloc)

{
  interval<unsigned_long> *key;
  Path *this_00;
  Path *this_01;
  uint32_t *puVar1;
  uint uVar2;
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_02;
  size_type sVar3;
  pointer pEVar4;
  bool bVar5;
  uint32_t uVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  EVP_PKEY_CTX *ctx;
  allocator_type *ctx_00;
  ulong uVar10;
  interval<unsigned_long> newKey;
  interval<unsigned_long> newKey_00;
  anon_class_16_2_46e3eac0 updateCurrKey;
  iterator nextIt;
  anon_class_16_2_3faad3b2 getCurrKey;
  
  this_02 = (this->super_iterator).super_const_iterator.map;
  key = &this->searchKey;
  if (this_02->height == 0) {
    uVar6 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_true>_>
            ::findUnionLeft((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_true>_>
                             *)this_02,0,this_02->rootSize,key);
    const_iterator::setRoot((const_iterator *)this,uVar6);
  }
  else {
    uVar6 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
            ::findUnionLeft((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
                             *)this_02,0,this_02->rootSize,key);
    const_iterator::setRoot((const_iterator *)this,uVar6);
    treeFindUnion(this);
  }
  sVar3 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if (sVar3 != 0) {
    this_00 = &(this->super_iterator).super_const_iterator.path;
    pEVar4 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    if (pEVar4->offset < pEVar4->size) {
      updateCurrKey.getCurrKey = &getCurrKey;
      updateCurrKey.this = this;
      getCurrKey.path = this_00;
      getCurrKey.this = this;
      bVar5 = IntervalMapDetails::interval<unsigned_long>::overlapsOrAdjacent
                        ((interval<unsigned_long> *)
                         ((ulong)pEVar4[sVar3 - 1].offset * 0x10 + (long)pEVar4[sVar3 - 1].node),key
                        );
      if (bVar5) {
        unionWith::anon_class_16_2_46e3eac0::operator()(&updateCurrKey,this->searchKey);
        iterator::updateParentBounds
                  (&this->super_iterator,
                   (int)(this->super_iterator).super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,key);
      }
      else {
        iterator::insert(&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,
                         alloc);
      }
      do {
        while( true ) {
          pEVar4 = (this->super_iterator).super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
          sVar3 = (this->super_iterator).super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
          uVar2 = pEVar4[sVar3 - 1].size;
          uVar9 = pEVar4[sVar3 - 1].offset + 1;
          uVar7 = (ulong)uVar9;
          if (((this->super_iterator).super_const_iterator.map)->height != 0) break;
          if (uVar2 <= uVar9) {
            return;
          }
          pvVar8 = pEVar4[sVar3 - 1].node;
          uVar10 = *(ulong *)((long)pvVar8 + uVar7 * 0x10);
          if ((this->searchKey).right + 1 < uVar10) {
            return;
          }
LAB_003e848e:
          newKey_00.right = *(unsigned_long *)((long)pvVar8 + uVar7 * 0x10 + 8);
          newKey_00.left = uVar10;
          unionWith::anon_class_16_2_46e3eac0::operator()(&updateCurrKey,newKey_00);
          (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
          [(this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset = uVar9;
          iterator::erase(&this->super_iterator,alloc,false);
          puVar1 = &(this->super_iterator).super_const_iterator.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                    [(this->super_iterator).super_const_iterator.path.path.
                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
          *puVar1 = *puVar1 - 1;
        }
        if (uVar9 < uVar2) {
          pvVar8 = pEVar4[sVar3 - 1].node;
          uVar10 = *(ulong *)((long)pvVar8 + uVar7 * 0x10);
          if (uVar10 <= (this->searchKey).right + 1) goto LAB_003e848e;
        }
        if (uVar9 != uVar2) {
          return;
        }
        const_iterator::const_iterator(&nextIt.super_const_iterator,(const_iterator *)this);
        ctx = (EVP_PKEY_CTX *)(ulong)this_02->height;
        this_01 = &nextIt.super_const_iterator.path;
        IntervalMapDetails::Path::moveRight(this_01,this_02->height);
        if (((nextIt.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
            ((nextIt.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size <=
             (nextIt.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset)) ||
           (nextIt.super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
            [nextIt.super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size == 0)) {
LAB_003e84d1:
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_01,ctx);
          return;
        }
        ctx = *nextIt.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
               [nextIt.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node;
        if ((EVP_PKEY_CTX *)((this->searchKey).right + 1) < ctx) goto LAB_003e84d1;
        newKey.right = *(ulong *)((long)nextIt.super_const_iterator.path.path.
                                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                        .data_[nextIt.super_const_iterator.path.path.
                                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                               .len - 1].node + 8);
        newKey.left = (unsigned_long)ctx;
        unionWith::anon_class_16_2_46e3eac0::operator()(&updateCurrKey,newKey);
        iterator::updateParentBounds
                  (&this->super_iterator,
                   (int)(this->super_iterator).super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1,key);
        ctx_00 = alloc;
        bVar5 = iterator::erase(&nextIt,alloc,true);
        if (bVar5) {
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00,
                     (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_01);
          ctx_00 = (allocator_type *)(ulong)this_02->height;
          IntervalMapDetails::Path::moveLeft(this_00,this_02->height);
        }
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                  ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_01,
                   (EVP_PKEY_CTX *)ctx_00);
      } while( true );
    }
  }
  iterator::insert(&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,alloc)
  ;
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}